

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_decoder_ms.c
# Opt level: O1

void bp_setup_ms(mod2sparse *H,double error_prob,double *log_prob_ratios,char *decoding)

{
  int iVar1;
  int iVar2;
  mod2entry *pmVar3;
  double dVar4;
  long lVar5;
  
  log_prob_ratio_initial = log((1.0 - error_prob) / error_prob);
  iVar1 = H->n_cols;
  if (0 < (long)iVar1) {
    lVar5 = 0;
    do {
      dVar4 = log_prob_ratio_initial;
      pmVar3 = H->cols[lVar5].down;
      iVar2 = pmVar3->row;
      while (-1 < iVar2) {
        pmVar3->pr = dVar4;
        pmVar3->lr = 1.0;
        pmVar3 = pmVar3->down;
        iVar2 = pmVar3->row;
      }
      decoding[lVar5] = '\0';
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar1);
  }
  return;
}

Assistant:

void bp_setup_ms(mod2sparse *H,
    double error_prob,
    double *log_prob_ratios,
    char *decoding)
    {

  mod2entry *e;
  int N;
  int j;
  

  log_prob_ratio_initial=log((1-error_prob)/error_prob);
  N = mod2sparse_cols(H);

  for (j = 0; j<N; j++)
    { 
      for (e = mod2sparse_first_in_col(H,j);
            !mod2sparse_at_end(e);
            e = mod2sparse_next_in_col(e))
        { 
          e->pr = log_prob_ratio_initial;
          e->lr = 1;
        }
    // log_prob_ratios[j]=log_prob_ratio_initial;
    decoding[j]=0;
    }

}